

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall vm::VM::Tscan<int>(VM *this)

{
  int iVar1;
  undefined8 in_RAX;
  long *plVar2;
  undefined8 *puVar3;
  int value;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  plVar2 = (long *)std::istream::operator>>((istream *)&std::cin,&local_14);
  if ((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) == 0) {
    ensureStackRest(this,1);
    iVar1 = this->_sp;
    this->_sp = iVar1 + 1;
    (this->_stack)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl[iVar1] = local_14;
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_00124d30;
  __cxa_throw(puVar3,&IOError::typeinfo,std::exception::~exception);
}

Assistant:

void VM::Tscan() {
    if (T value; std::cin >> value) {
        PUSH(value);
    }
    else {
        throw IOError();
    }
}